

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::analysis::DebugInfoManager::IsAncestorOfScope
          (DebugInfoManager *this,uint32_t scope,uint32_t ancestor)

{
  for (; (scope != ancestor && (scope != 0)); scope = GetParentScope(this,scope)) {
  }
  return scope != 0;
}

Assistant:

bool DebugInfoManager::IsAncestorOfScope(uint32_t scope, uint32_t ancestor) {
  uint32_t ancestor_scope_itr = scope;
  while (ancestor_scope_itr != kNoDebugScope) {
    if (ancestor == ancestor_scope_itr) return true;
    ancestor_scope_itr = GetParentScope(ancestor_scope_itr);
  }
  return false;
}